

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_2_expr.h
# Opt level: O0

bool __thiscall
mp::
Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::HasExpressionArgs(Constraints2Expr<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                    *this,LinTerms *lt)

{
  bool bVar1;
  FlatModel<mp::DefaultFlatModelParams> *pFVar2;
  int v;
  int *__end2;
  int *__begin2;
  ArrayRef<int> *__range2;
  int in_stack_ffffffffffffff6c;
  ArrayRef<int> *in_stack_ffffffffffffff70;
  FlatModel<mp::DefaultFlatModelParams> *this_00;
  LinTerms *in_stack_ffffffffffffff88;
  int local_6c;
  FlatModel<mp::DefaultFlatModelParams> *local_50;
  undefined1 local_48 [40];
  undefined1 *local_20;
  byte local_1;
  
  LinTerms::vars(in_stack_ffffffffffffff88);
  local_20 = local_48;
  local_50 = (FlatModel<mp::DefaultFlatModelParams> *)
             ArrayRef<int>::begin((ArrayRef<int> *)0x199bef);
  pFVar2 = (FlatModel<mp::DefaultFlatModelParams> *)ArrayRef<int>::end(in_stack_ffffffffffffff70);
  this_00 = pFVar2;
  do {
    if (local_50 == pFVar2) {
      local_6c = 2;
LAB_00199ca5:
      ArrayRef<int>::~ArrayRef((ArrayRef<int> *)0x199caf);
      if (local_6c != 1) {
        local_1 = 0;
      }
      return (bool)(local_1 & 1);
    }
    bVar1 = FlatModel<mp::DefaultFlatModelParams>::IsProperVar(this_00,in_stack_ffffffffffffff6c);
    in_stack_ffffffffffffff6c = CONCAT13(bVar1,(int3)in_stack_ffffffffffffff6c);
    if (!bVar1) {
      local_1 = 1;
      local_6c = 1;
      goto LAB_00199ca5;
    }
    local_50 = (FlatModel<mp::DefaultFlatModelParams> *)
               ((long)&(local_50->super_BasicFlatModel)._vptr_BasicFlatModel + 4);
  } while( true );
}

Assistant:

bool HasExpressionArgs(const LinTerms& lt) const {
    for (auto v: lt.vars())
      if (!MPCD( IsProperVar(v) )) {
        return true;
      }
    return false;
  }